

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  undefined4 uVar1;
  Which WVar2;
  Which WVar3;
  short sVar4;
  uint64_t scopeId;
  CapTableReader *pCVar5;
  int iVar6;
  uint uVar7;
  uint64_t replacementScopeId;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> _kjCondition;
  Fault f;
  PointerReader local_50;
  
  if ((node->_reader).dataSize < 0x70) {
    WVar2 = FILE;
  }
  else {
    WVar2 = *(Which *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    WVar3 = FILE;
  }
  else {
    WVar3 = *(Which *)((long)(replacement->_reader).data + 0xc);
  }
  _kjCondition.right = WVar3;
  _kjCondition.left = WVar2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = WVar2 == WVar3;
  if (WVar2 == WVar3) {
    iVar6 = 0x7fffffff;
    if ((replacement->_reader).pointerCount < 6) {
      f.exception = (Exception *)0x0;
      uVar7 = 0x7fffffff;
    }
    else {
      f.exception = (Exception *)(replacement->_reader).segment;
      uVar7 = (replacement->_reader).nestingLimit;
    }
    pCVar5 = (CapTableReader *)0x0;
    capnp::_::PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
    uVar1 = _kjCondition._24_4_;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    if (5 < (node->_reader).pointerCount) {
      local_50.segment = (node->_reader).segment;
      pCVar5 = (node->_reader).capTable;
      local_50.pointer = (node->_reader).pointers + 5;
      iVar6 = (node->_reader).nestingLimit;
    }
    local_50.capTable = pCVar5;
    local_50.nestingLimit = iVar6;
    capnp::_::PointerReader::getList((ListReader *)&f,&local_50,INLINE_COMPOSITE,(word *)0x0);
    if (uVar7 < (uint)uVar1) {
      replacementIsNewer(this);
    }
    else {
      iVar6 = 0x7fffffff;
      if ((replacement->_reader).pointerCount < 6) {
        f.exception = (Exception *)0x0;
        uVar7 = 0x7fffffff;
      }
      else {
        f.exception = (Exception *)(replacement->_reader).segment;
        uVar7 = (replacement->_reader).nestingLimit;
      }
      pCVar5 = (CapTableReader *)0x0;
      capnp::_::PointerReader::getList
                ((ListReader *)&_kjCondition,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
      uVar1 = _kjCondition._24_4_;
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)0x0;
      if (5 < (node->_reader).pointerCount) {
        local_50.segment = (node->_reader).segment;
        pCVar5 = (node->_reader).capTable;
        local_50.pointer = (node->_reader).pointers + 5;
        iVar6 = (node->_reader).nestingLimit;
      }
      local_50.capTable = pCVar5;
      local_50.nestingLimit = iVar6;
      capnp::_::PointerReader::getList((ListReader *)&f,&local_50,INLINE_COMPOSITE,(word *)0x0);
      if ((uint)uVar1 < uVar7) {
        replacementIsOlder(this);
      }
    }
    uVar7 = (node->_reader).dataSize;
    if (uVar7 < 0x70) {
      sVar4 = 0;
    }
    else {
      sVar4 = *(short *)((long)(node->_reader).data + 0xc);
    }
    if (sVar4 == 3) {
      _kjCondition._0_8_ = (node->_reader).segment;
      _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
      _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
      _kjCondition._24_8_ = (node->_reader).pointers;
      f.exception = (Exception *)(replacement->_reader).segment;
      checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
    }
    else if (sVar4 == 2) {
      _kjCondition._0_8_ = (node->_reader).segment;
      _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
      _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
      _kjCondition._24_8_ = (node->_reader).pointers;
      f.exception = (Exception *)(replacement->_reader).segment;
      checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
    }
    else if (sVar4 == 1) {
      _kjCondition._0_8_ = (node->_reader).segment;
      _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
      _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
      _kjCondition._24_8_ = (node->_reader).pointers;
      f.exception = (Exception *)(replacement->_reader).segment;
      if (uVar7 < 0xc0) {
        scopeId = 0;
      }
      else {
        scopeId = *(uint64_t *)((long)(node->_reader).data + 0x10);
      }
      if ((replacement->_reader).dataSize < 0xc0) {
        replacementScopeId = 0;
      }
      else {
        replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f,scopeId,replacementScopeId);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which>&,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2c1,FAILED,"node.which() == replacement.which()",
               "_kjCondition,\"kind of declaration changed\"",&_kjCondition,
               (char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }